

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  Session *pSVar1;
  Config *pCVar2;
  int iVar3;
  Session *this_00;
  InternalParseResult result;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  undefined1 local_b8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  undefined1 local_80 [64];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  iVar3 = 1;
  if (this->m_startupExceptions == false) {
    Clara::Args::Args((Args *)local_b8,argc,argv);
    Clara::Detail::ParserBase::parse
              ((InternalParseResult *)local_80,(ParserBase *)this,(Args *)local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    pSVar1 = (Session *)(local_b8 + 0x10);
    this_00 = (Session *)local_b8._0_8_;
    if ((Session *)local_b8._0_8_ != pSVar1) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    if (local_80._8_4_ == Ok) {
      if ((this->m_configData).showHelp == true) {
        this_00 = this;
        showHelp(this);
      }
      if ((this->m_configData).libIdentify == true) {
        libIdentify(this_00);
      }
      pCVar2 = (this->m_config).m_ptr;
      if (pCVar2 != (Config *)0x0) {
        (*(pCVar2->super_IConfig)._vptr_IConfig[1])();
      }
      (this->m_config).m_ptr = (Config *)0x0;
      iVar3 = 0;
    }
    else {
      config(this);
      if (IMutableContext::currentContext == (long *)0x0) {
        IMutableContext::currentContext = (long *)operator_new(0x20);
        *IMutableContext::currentContext = 0;
        IMutableContext::currentContext[1] = 0;
        IMutableContext::currentContext[2] = 0;
        IMutableContext::currentContext[3] = 0;
        *IMutableContext::currentContext = (long)&PTR__Context_001fbb60;
        IMutableContext::currentContext[1] = 0;
        IMutableContext::currentContext[2] = 0;
        IMutableContext::currentContext[3] = 0;
      }
      (**(code **)(*IMutableContext::currentContext + 0x38))
                (IMutableContext::currentContext,(this->m_config).m_ptr);
      Colour::use(Red);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\nError(s) in input:\n",0x14);
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_40._M_p,local_40._M_p + local_38);
      local_b8._0_8_ = pSVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,local_d8,local_d0 + (long)local_d8);
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4f;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffffffffffffffff;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
      TextFlow::operator<<((ostream *)&std::cerr,(Column *)local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n\n",2);
      if ((Session *)local_b8._0_8_ != pSVar1) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      Colour::use(None);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Run with -? for usage\n",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
      std::ostream::put('@');
      iVar3 = 0xff;
      std::ostream::flush();
    }
    local_80._0_8_ = &PTR__BasicResult_001fcea0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
    local_80._0_8_ = &PTR__ResultValueBase_001fcef8;
    if (local_80._8_4_ == Ok) {
      std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
      ~vector((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *)
              (local_80 + 0x28));
    }
  }
  return iVar3;
}

Assistant:

int Session::applyCommandLine(int argc, char const *const *argv) {
        if (m_startupExceptions)
            return 1;

        auto result = m_cli.parse(Clara::Args(argc, argv));
        if (!result) {
            config();
            getCurrentMutableContext().setConfig(m_config.get());
            Catch::cerr()
                << Colour(Colour::Red)
                << "\nError(s) in input:\n"
                << TextFlow::Column(result.errorMessage()).indent(2)
                << "\n\n";
            Catch::cerr() << "Run with -? for usage\n" << std::endl;
            return MaxExitCode;
        }

        if (m_configData.showHelp)
            showHelp();
        if (m_configData.libIdentify)
            libIdentify();
        m_config.reset();
        return 0;
    }